

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O0

char * hms_for_sec(time_t tv_sec)

{
  tm *ptVar1;
  tm *now;
  time_t tv_sec_local;
  
  if (tv_sec != hms_for_sec::cached_tv_sec) {
    now = (tm *)tv_sec;
    ptVar1 = localtime((time_t *)&now);
    curl_msnprintf(hms_for_sec::hms_buf,0xc,"%02d:%02d:%02d",ptVar1->tm_hour,ptVar1->tm_min,
                   ptVar1->tm_sec);
    hms_for_sec::cached_tv_sec = (time_t)now;
  }
  return hms_for_sec::hms_buf;
}

Assistant:

static const char *hms_for_sec(time_t tv_sec)
{
  static time_t cached_tv_sec;
  static char hms_buf[12];

  if(tv_sec != cached_tv_sec) {
    /* !checksrc! disable BANNEDFUNC 1 */
    struct tm *now = localtime(&tv_sec);  /* not thread safe either */
    msnprintf(hms_buf, sizeof(hms_buf), "%02d:%02d:%02d",
              now->tm_hour, now->tm_min, now->tm_sec);
    cached_tv_sec = tv_sec;
  }
  return hms_buf;
}